

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformations.c
# Opt level: O0

int al_check_inverse(ALLEGRO_TRANSFORM *trans,float tol)

{
  float fVar1;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_24;
  float c3;
  float c1;
  float c0;
  float norm;
  float det;
  float tol_local;
  ALLEGRO_TRANSFORM *trans_local;
  
  local_30 = ABS(trans->m[0][0]) + ABS(trans->m[0][1]);
  fVar1 = ABS(trans->m[1][0]) + ABS(trans->m[1][1]);
  local_38 = ABS(trans->m[3][0]) + ABS(trans->m[3][1]) + 1.0;
  local_24 = local_30;
  if (local_30 < 1.0) {
    local_24 = 1.0;
  }
  local_2c = local_38;
  if (local_38 < fVar1) {
    local_2c = fVar1;
  }
  if (local_24 <= local_2c) {
    if (local_38 < fVar1) {
      local_38 = fVar1;
    }
    local_34 = local_38;
  }
  else {
    if (local_30 < 1.0) {
      local_30 = 1.0;
    }
    local_34 = local_30;
  }
  return (int)(tol * local_34 <
              ABS(trans->m[0][0] * trans->m[1][1] + -(trans->m[1][0] * trans->m[0][1])));
}

Assistant:

int al_check_inverse(const ALLEGRO_TRANSFORM *trans, float tol)
{
   float det, norm, c0, c1, c3;
   ASSERT(trans);

   det = fabsf(trans->m[0][0] *  trans->m[1][1] -  trans->m[1][0] *  trans->m[0][1]);
   /*
   We'll use the 1-norm, as it is the easiest to compute
   */
   c0 = fabsf(trans->m[0][0]) + fabsf(trans->m[0][1]);
   c1 = fabsf(trans->m[1][0]) + fabsf(trans->m[1][1]);
   c3 = fabsf(trans->m[3][0]) + fabsf(trans->m[3][1]) + 1;
   norm = _ALLEGRO_MAX(_ALLEGRO_MAX(1, c0), _ALLEGRO_MAX(c1, c3));

   return det > tol * norm;
}